

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O1

void __thiscall
spdlog::details::thread_pool::thread_pool
          (thread_pool *this,size_t q_max_items,size_t threads_n,function<void_()> *on_thread_start,
          function<void_()> *on_thread_stop)

{
  pointer *pptVar1;
  allocator_type *paVar2;
  allocator_type *paVar3;
  size_type __n;
  thread *ptVar4;
  allocator_type *paVar5;
  anon_class_72_3_9989dd16_for__M_head_impl *__args;
  anon_class_72_3_9989dd16_for__M_head_impl *extraout_RDX;
  anon_class_72_3_9989dd16_for__M_head_impl *extraout_RDX_00;
  anon_class_72_3_9989dd16_for__M_head_impl *__args_00;
  allocator_type *__a;
  size_t sVar6;
  thread *__cur;
  thread *ptVar7;
  thread local_98;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  string local_50;
  
  mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue(&this->q_,q_max_items);
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (threads_n - 0x3e9 < 0xfffffffffffffc18) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,
               "spdlog::thread_pool(): invalid threads_n param (valid range is 1-1000)","");
    throw_spdlog_ex(&local_50);
  }
  if (threads_n != 0) {
    sVar6 = 0;
    do {
      local_98._M_id._M_thread = (id)(id)this;
      std::function<void_()>::function((function<void_()> *)&local_90,on_thread_start);
      std::function<void_()>::function((function<void_()> *)&local_70,on_thread_stop);
      __a = (allocator_type *)
            (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish;
      if (__a == (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&this->threads_,1,"vector::_M_realloc_insert");
        paVar2 = (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        paVar3 = (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__n == 0) {
          ptVar4 = (thread *)0x0;
          __args_00 = extraout_RDX;
        }
        else {
          ptVar4 = __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&this->threads_,__n,(void *)0x0);
          __args_00 = extraout_RDX_00;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::__0>
                  ((allocator_type *)(ptVar4 + ((long)__a - (long)paVar2 >> 3)),&local_98,__args_00)
        ;
        ptVar7 = ptVar4;
        for (paVar5 = paVar2; paVar5 != __a; paVar5 = paVar5 + 8) {
          (ptVar7->_M_id)._M_thread = 0;
          (ptVar7->_M_id)._M_thread = *(native_handle_type *)paVar5;
          *(undefined8 *)paVar5 = 0;
          ptVar7 = ptVar7 + 1;
        }
        for (; ptVar7 = ptVar7 + 1, paVar3 != __a; __a = __a + 8) {
          (ptVar7->_M_id)._M_thread = 0;
          (ptVar7->_M_id)._M_thread = *(native_handle_type *)__a;
          *(undefined8 *)__a = 0;
        }
        if (paVar2 != (allocator_type *)0x0) {
          operator_delete(paVar2);
        }
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar4;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar7;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar4 + __n;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>,std::function<void()>)::__0>
                  (__a,&local_98,__args);
        pptVar1 = &(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *pptVar1 = *pptVar1 + 1;
      }
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      if (local_80 != (code *)0x0) {
        (*local_80)(&local_90,&local_90,__destroy_functor);
      }
      sVar6 = sVar6 + 1;
    } while (sVar6 != threads_n);
  }
  return;
}

Assistant:

SPDLOG_INLINE thread_pool::thread_pool(
    size_t q_max_items, size_t threads_n, std::function<void()> on_thread_start, std::function<void()> on_thread_stop)
    : q_(q_max_items)
{
    if (threads_n == 0 || threads_n > 1000)
    {
        throw_spdlog_ex("spdlog::thread_pool(): invalid threads_n param (valid "
                        "range is 1-1000)");
    }
    for (size_t i = 0; i < threads_n; i++)
    {
        threads_.emplace_back([this, on_thread_start, on_thread_stop] {
            on_thread_start();
            this->thread_pool::worker_loop_();
            on_thread_stop();
        });
    }
}